

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SyntaxList<slang::syntax::RsProdSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>,slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::RsProdSyntax> *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  SyntaxList<slang::syntax::RsProdSyntax> *pSVar4;
  
  pSVar4 = (SyntaxList<slang::syntax::RsProdSyntax> *)allocate(this,0x38,8);
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar4->super_SyntaxListBase).super_SyntaxNode.field_0x4 = uVar3;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent = pSVar1;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pSVar4->super_SyntaxListBase)._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002da6d8;
  (pSVar4->super_SyntaxListBase).childCount = (args->super_SyntaxListBase).childCount;
  sVar2 = (args->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pSVar4->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>)._M_ptr =
       (args->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pSVar4->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>)._M_extent.
  _M_extent_value = sVar2;
  (pSVar4->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002dbb28;
  return pSVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }